

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O0

PSpriteAmiga __thiscall
DataSourceAmiga::SpriteAmiga::split_horizontaly(SpriteAmiga *this,bool return_right)

{
  element_type *peVar1;
  byte in_DL;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined7 in_register_00000031;
  long lVar3;
  PSpriteAmiga PVar4;
  ulong local_50;
  size_t x;
  size_t y;
  uint32_t *res;
  uint32_t *src;
  ulong local_28;
  size_t res_width;
  long lStack_18;
  bool return_right_local;
  SpriteAmiga *this_local;
  PSpriteAmiga *s;
  
  lVar3 = CONCAT71(in_register_00000031,return_right);
  res_width._7_1_ = in_DL & 1;
  local_28 = *(ulong *)(lVar3 + 0x28) >> 1;
  lStack_18 = lVar3;
  this_local = this;
  std::make_shared<DataSourceAmiga::SpriteAmiga,unsigned_long&,unsigned_long&>
            ((unsigned_long *)this,&local_28);
  res = *(uint32_t **)(lVar3 + 0x38);
  peVar1 = std::
           __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  y = (size_t)(peVar1->super_SpriteBase).data;
  if ((res_width._7_1_ & 1) != 0) {
    res = res + local_28;
  }
  _Var2._M_pi = extraout_RDX;
  for (x = 0; x < *(ulong *)(lVar3 + 0x30); x = x + 1) {
    for (local_50 = 0; local_50 < local_28; local_50 = local_50 + 1) {
      _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(y + 4);
      *(uint32_t *)y = *res;
      y = (size_t)_Var2._M_pi;
      res = res + 1;
    }
    res = res + local_28;
  }
  PVar4.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  PVar4.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (PSpriteAmiga)
         PVar4.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::SpriteAmiga::split_horizontaly(bool return_right) {
  size_t res_width = width/2;
  PSpriteAmiga s = std::make_shared<SpriteAmiga>(res_width, height);
  uint32_t *src = reinterpret_cast<uint32_t*>(data);
  uint32_t *res = reinterpret_cast<uint32_t*>(s->data);
  if (return_right) {
    src += res_width;
  }
  for (size_t y = 0; y < height; y++) {
    for (size_t x = 0; x < res_width; x++) {
      *res++ = *src++;
    }
    src += res_width;
  }

  return s;
}